

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walltime.cc
# Opt level: O3

void __thiscall benchmark::walltime::anon_unknown_1::WallTimeImp::WallTimeImp(WallTimeImp *this)

{
  ulong uVar1;
  double dVar2;
  long lVar3;
  undefined4 extraout_var;
  timeval tv;
  timeval local_20;
  
  this->last_adjust_time_ = 0;
  this->drift_adjust_ = (__atomic_base<int>)0x0;
  this->max_interval_cycles_ = 0;
  this->cycles_per_second_ = 0;
  this->seconds_per_cycle_ = 0.0;
  this->base_walltime_ = 0.0;
  this->base_cycletime_ = 0;
  dVar2 = CyclesPerSecond();
  this->cycles_per_second_ = (long)dVar2;
  if ((long)dVar2 != 0) {
    internal::GetNullLogInstance();
    lVar3 = (long)((double)this->cycles_per_second_ * 0.0001);
    this->seconds_per_cycle_ = 1.0 / (double)this->cycles_per_second_;
    this->max_interval_cycles_ = lVar3;
    do {
      uVar1 = rdtsc();
      this->base_cycletime_ =
           uVar1 & 0xffffffff00000000 | CONCAT44((int)((ulong)lVar3 >> 0x20),(int)uVar1);
      gettimeofday(&local_20,(__timezone_ptr_t)0x0);
      this->base_walltime_ = (double)local_20.tv_usec * 1e-06 + (double)local_20.tv_sec;
      uVar1 = rdtsc();
      lVar3 = this->base_cycletime_;
    } while (this->max_interval_cycles_ <
             (long)((uVar1 & 0xffffffff00000000 | CONCAT44(extraout_var,(int)uVar1)) - lVar3));
    LOCK();
    (this->drift_adjust_).super___atomic_base<int>._M_i = 0;
    UNLOCK();
    this->last_adjust_time_ = (uint32_t)((ulong)lVar3 >> 0x20);
    return;
  }
  internal::CheckHandler::CheckHandler
            ((CheckHandler *)&local_20,"cycles_per_second_ != 0",
             "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/walltime.cc"
             ,"WallTimeImp",0xa6);
  internal::CheckHandler::~CheckHandler((CheckHandler *)&local_20);
}

Assistant:

WallTimeImp::WallTimeImp()
    : base_walltime_(0.0), base_cycletime_(0),
      cycles_per_second_(0), seconds_per_cycle_(0.0),
      last_adjust_time_(0), drift_adjust_(0),
      max_interval_cycles_(0) {
  const double kMaxErrorInterval = 100e-6;
  cycles_per_second_ = static_cast<int64_t>(CyclesPerSecond());
  CHECK(cycles_per_second_ != 0);
  seconds_per_cycle_ = 1.0 / cycles_per_second_;
  max_interval_cycles_ =
      static_cast<int64_t>(cycles_per_second_ * kMaxErrorInterval);
  do {
    base_cycletime_ = cycleclock::Now();
    base_walltime_ = Slow();
  } while (cycleclock::Now() - base_cycletime_ > max_interval_cycles_);
  // We are now sure that "base_walltime" and "base_cycletime" were produced
  // within kMaxErrorInterval of one another.

  SetDrift(0.0);
  last_adjust_time_ = static_cast<uint32_t>(uint64_t(base_cycletime_) >> 32);
}